

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util-ossl.cpp
# Opt level: O2

int crypto_import_certificate
              (CK_SESSION_HANDLE hSession,char *filePath,char *label,char *objID,size_t objIDLen)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  BIO *bp;
  X509 *a;
  X509_NAME *pXVar6;
  ASN1_INTEGER *pAVar7;
  CK_BYTE_PTR pCVar8;
  CK_BYTE_PTR __ptr;
  undefined4 extraout_var;
  CK_BYTE_PTR __ptr_00;
  ulong uVar9;
  CK_RV CVar10;
  char *pcVar11;
  size_t sStack_1b0;
  CK_BYTE_PTR local_1a8;
  uint local_198;
  CK_BBOOL ckTrue;
  CK_BBOOL ckFalse;
  CK_BYTE_PTR local_190;
  CK_BYTE_PTR local_188;
  X509 *local_180;
  ulong local_178;
  CK_BYTE_PTR p;
  ulong local_168;
  CK_SESSION_HANDLE local_160;
  char *local_158;
  size_t local_150;
  char *local_148;
  CK_OBJECT_HANDLE hCert;
  CK_CERTIFICATE_TYPE certType;
  CK_OBJECT_CLASS certClass;
  CK_ATTRIBUTE certTemplate [10];
  undefined4 extraout_var_00;
  
  bp = BIO_new_file(filePath,"rb");
  if (bp == (BIO *)0x0) {
    pcVar11 = "ERROR: Could open the PKCS#8 file: %s\n";
  }
  else {
    local_148 = label;
    a = PEM_read_bio_X509(bp,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
    if (a != (X509 *)0x0) {
      local_158 = objID;
      local_150 = objIDLen;
      uVar1 = i2d_X509(a,(uchar **)0x0);
      pXVar6 = X509_get_subject_name(a);
      uVar2 = i2d_X509_NAME(pXVar6,(uchar **)0x0);
      pXVar6 = X509_get_issuer_name(a);
      uVar3 = i2d_X509_NAME(pXVar6,(uchar **)0x0);
      pAVar7 = X509_get_serialNumber(a);
      uVar4 = i2d_ASN1_INTEGER(pAVar7,(uchar **)0x0);
      local_180 = a;
      if (((((int)uVar1 < 0) || ((int)uVar2 < 0)) || ((int)uVar3 < 0)) || ((int)uVar4 < 0)) {
        pcVar11 = "ERROR: Could not convert certificate to DER.\n";
        sStack_1b0 = 0x2d;
LAB_00115526:
        fwrite(pcVar11,sStack_1b0,1,_stderr);
        __ptr = (CK_BYTE_PTR)0x0;
        __ptr_00 = (CK_BYTE_PTR)0x0;
        pCVar8 = (CK_BYTE_PTR)0x0;
      }
      else {
        local_178 = 0;
        if (uVar1 == 0) {
          local_190 = (CK_BYTE_PTR)0x0;
          local_198 = 0;
        }
        else {
          pCVar8 = (CK_BYTE_PTR)malloc((ulong)uVar1);
          if (pCVar8 == (CK_BYTE_PTR)0x0) {
            pcVar11 = "ERROR: Could not allocate memory.\n";
            sStack_1b0 = 0x22;
            goto LAB_00115526;
          }
          local_190 = pCVar8;
          p = pCVar8;
          local_198 = i2d_X509(a,&p);
        }
        if (uVar2 == 0) {
          __ptr = (CK_BYTE_PTR)0x0;
LAB_001151e9:
          if (uVar3 == 0) {
            __ptr_00 = (CK_BYTE_PTR)0x0;
            uVar1 = 0;
          }
          else {
            __ptr_00 = (CK_BYTE_PTR)malloc((ulong)uVar3);
            if (__ptr_00 == (CK_BYTE_PTR)0x0) {
              fwrite("ERROR: Could not allocate memory.\n",0x22,1,_stderr);
              goto LAB_0011558a;
            }
            p = __ptr_00;
            pXVar6 = X509_get_issuer_name(a);
            uVar1 = i2d_X509_NAME(pXVar6,&p);
          }
          uVar9 = 0;
          local_188 = __ptr_00;
          if (uVar4 == 0) {
            local_1a8 = (CK_BYTE_PTR)0x0;
          }
          else {
            local_1a8 = (CK_BYTE_PTR)malloc((ulong)uVar4);
            if (local_1a8 == (CK_BYTE_PTR)0x0) {
              fwrite("ERROR: Could not allocate memory.\n",0x22,1,_stderr);
              pCVar8 = local_190;
              goto LAB_001155bc;
            }
            p = local_1a8;
            pAVar7 = X509_get_serialNumber(a);
            iVar5 = i2d_ASN1_INTEGER(pAVar7,&p);
            uVar9 = CONCAT44(extraout_var_00,iVar5);
          }
          if ((((int)local_198 < 0) || ((int)local_178 < 0)) ||
             (((int)uVar1 < 0 || ((int)uVar9 < 0)))) {
            fwrite("ERROR: Could not convert certificate to DER.\n",0x2d,1,_stderr);
            uVar1 = 1;
            pCVar8 = local_190;
            __ptr_00 = local_188;
          }
          else {
            certTemplate[0].pValue = &certClass;
            certClass = 1;
            certTemplate[1].pValue = &certType;
            certType = 0;
            ckFalse = '\0';
            ckTrue = '\x01';
            certTemplate[0].type = 0;
            certTemplate[0].ulValueLen = 8;
            certTemplate[1].type = 0x80;
            certTemplate[1].ulValueLen = 8;
            certTemplate[2].type = 3;
            certTemplate[2].pValue = local_148;
            local_168 = uVar9;
            local_160 = hSession;
            certTemplate[2].ulValueLen = strlen(local_148);
            pCVar8 = local_190;
            certTemplate[3].type = 0x102;
            certTemplate[3].pValue = local_158;
            certTemplate[3].ulValueLen = local_150;
            certTemplate[4].type = 1;
            certTemplate[4].ulValueLen = 1;
            certTemplate[5].type = 2;
            certTemplate[5].ulValueLen = 1;
            certTemplate[6].type = 0x11;
            certTemplate[6].pValue = local_190;
            certTemplate[6].ulValueLen = (unsigned_long)local_198;
            certTemplate[7].type = 0x101;
            certTemplate[7].ulValueLen = local_178 & 0xffffffff;
            certTemplate[8].type = 0x81;
            certTemplate[8].pValue = local_188;
            certTemplate[9].type = 0x82;
            certTemplate[9].pValue = local_1a8;
            certTemplate[9].ulValueLen = local_168 & 0xffffffff;
            certTemplate[4].pValue = &ckTrue;
            certTemplate[5].pValue = &ckFalse;
            certTemplate[7].pValue = __ptr;
            certTemplate[8].ulValueLen = (ulong)uVar1;
            CVar10 = (*p11->C_CreateObject)(local_160,certTemplate,10,&hCert);
            if (CVar10 != 0) {
              fwrite("ERROR: Could not save the certificate in the token.\n",0x34,1,_stderr);
            }
            else {
              puts("The certificate has been imported.");
            }
            uVar1 = (uint)(CVar10 != 0);
            __ptr_00 = local_188;
          }
          goto LAB_00115412;
        }
        __ptr = (CK_BYTE_PTR)malloc((ulong)uVar2);
        if (__ptr != (CK_BYTE_PTR)0x0) {
          p = __ptr;
          pXVar6 = X509_get_subject_name(a);
          iVar5 = i2d_X509_NAME(pXVar6,&p);
          local_178 = CONCAT44(extraout_var,iVar5);
          goto LAB_001151e9;
        }
        fwrite("ERROR: Could not allocate memory.\n",0x22,1,_stderr);
        __ptr = (CK_BYTE_PTR)0x0;
LAB_0011558a:
        __ptr_00 = (CK_BYTE_PTR)0x0;
        pCVar8 = local_190;
      }
LAB_001155bc:
      uVar1 = 1;
      local_1a8 = (CK_BYTE_PTR)0x0;
      goto LAB_00115412;
    }
    pcVar11 = "ERROR: Could not read the certificate file: %s\n";
  }
  local_180 = (X509 *)0x0;
  fprintf(_stderr,pcVar11,filePath);
  uVar1 = 1;
  __ptr = (CK_BYTE_PTR)0x0;
  local_1a8 = (CK_BYTE_PTR)0x0;
  pCVar8 = (CK_BYTE_PTR)0x0;
  __ptr_00 = (CK_BYTE_PTR)0x0;
LAB_00115412:
  free(pCVar8);
  free(__ptr);
  free(__ptr_00);
  free(local_1a8);
  X509_free(local_180);
  BIO_free(bp);
  return uVar1;
}

Assistant:

int crypto_import_certificate
(
	CK_SESSION_HANDLE hSession,
	char* filePath,
	char* label,
	char* objID,
	size_t objIDLen
)
{
	BIO* in = NULL;
	X509* x509 = NULL;
	CK_BYTE_PTR blob = NULL;
	CK_BYTE_PTR subject = NULL;
	CK_BYTE_PTR issuer = NULL;
	CK_BYTE_PTR serial = NULL;
	CK_BYTE_PTR p;
	int blobSize;
	int subjectSize;
	int issuerSize;
	int serialSize;
	int ret = 1;

	if (!(in = BIO_new_file(filePath, "rb")))
	{
		fprintf(stderr, "ERROR: Could open the PKCS#8 file: %s\n", filePath);
		goto cleanup;
	}

	if ((x509 = PEM_read_bio_X509(in, NULL, NULL, NULL)) == NULL)
	{
		fprintf(stderr, "ERROR: Could not read the certificate file: %s\n", filePath);
		goto cleanup;
	}

	blobSize = i2d_X509(x509, NULL);
	subjectSize = i2d_X509_NAME(X509_get_subject_name(x509), NULL);
	issuerSize = i2d_X509_NAME(X509_get_issuer_name(x509), NULL);
	serialSize = i2d_ASN1_INTEGER(X509_get_serialNumber(x509), NULL);

	if
	(
		blobSize < 0 ||
		subjectSize < 0 ||
		issuerSize < 0 ||
		serialSize < 0
	)
	{
		fprintf(stderr, "ERROR: Could not convert certificate to DER.\n");
		goto cleanup;
	}

	if (blobSize > 0)
	{
		if ((blob = (CK_BYTE_PTR)malloc(blobSize)) == NULL)
		{
			fprintf(stderr, "ERROR: Could not allocate memory.\n");
			goto cleanup;
		}
		p = blob;
		blobSize = i2d_X509(x509, &p);
	}
	if (subjectSize > 0) {
		if ((subject = (CK_BYTE_PTR)malloc(subjectSize)) == NULL)
		{
			fprintf(stderr, "ERROR: Could not allocate memory.\n");
			goto cleanup;
		}
		p = subject;
		subjectSize = i2d_X509_NAME(X509_get_subject_name(x509), &p);
	}
	if (issuerSize > 0)
	{
		if ((issuer = (CK_BYTE_PTR)malloc(issuerSize)) == NULL)
		{
			fprintf(stderr, "ERROR: Could not allocate memory.\n");
			goto cleanup;
		}
		p = issuer;
		issuerSize = i2d_X509_NAME(X509_get_issuer_name(x509), &p);
	}
	if (serialSize > 0)
	{
		if ((serial = (CK_BYTE_PTR)malloc(serialSize)) == NULL)
		{
			fprintf(stderr, "ERROR: Could not allocate memory.\n");
			goto cleanup;
		}
		p = serial;
		serialSize = i2d_ASN1_INTEGER(X509_get_serialNumber(x509), &p);
	}

	if
	(
		blobSize < 0 ||
		subjectSize < 0 ||
		issuerSize < 0 ||
		serialSize < 0
	)
	{
		fprintf(stderr, "ERROR: Could not convert certificate to DER.\n");
		goto cleanup;
	}

	{
		CK_OBJECT_CLASS certClass = CKO_CERTIFICATE;
		CK_CERTIFICATE_TYPE certType = CKC_X_509;
		CK_BBOOL ckFalse = CK_FALSE, ckTrue = CK_TRUE;
		CK_ATTRIBUTE certTemplate[] = {
			{ CKA_CLASS,            &certClass,   sizeof(certClass) },
			{ CKA_CERTIFICATE_TYPE, &certType,    sizeof(certType) },
			{ CKA_LABEL,            label,        strlen(label) },
			{ CKA_ID,               objID,        objIDLen },
			{ CKA_TOKEN,            &ckTrue,      sizeof(ckTrue) },
			{ CKA_PRIVATE,          &ckFalse,     sizeof(ckFalse) },
			{ CKA_VALUE,            blob,         (CK_ULONG)blobSize },
			{ CKA_SUBJECT,          subject,      (CK_ULONG)subjectSize },
			{ CKA_ISSUER,           issuer,       (CK_ULONG)issuerSize },
			{ CKA_SERIAL_NUMBER,    serial,       (CK_ULONG)serialSize }
		};

		CK_OBJECT_HANDLE hCert;
		CK_RV rv = p11->C_CreateObject(hSession, certTemplate, 10, &hCert);
		if (rv != CKR_OK)
		{
			fprintf(stderr, "ERROR: Could not save the certificate in the token.\n");
			goto cleanup;
		}
	}

	printf("The certificate has been imported.\n");

	ret = 0;

cleanup:

	free(blob);
	free(subject);
	free(issuer);
	free(serial);
	X509_free(x509);
	BIO_free(in);

	return ret;
}